

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O3

void VP8TBufferClear(VP8TBuffer *b)

{
  VP8Tokens *pVVar1;
  VP8Tokens *ptr;
  int iVar2;
  
  if (b != (VP8TBuffer *)0x0) {
    ptr = b->pages_;
    while (ptr != (VP8Tokens *)0x0) {
      pVVar1 = ptr->next_;
      WebPSafeFree(ptr);
      ptr = pVVar1;
    }
    b->tokens_ = (uint16_t *)0x0;
    b->pages_ = (VP8Tokens *)0x0;
    b->last_page_ = &b->pages_;
    b->left_ = 0;
    iVar2 = 0x2000;
    if (0x2000 < b->page_size_) {
      iVar2 = b->page_size_;
    }
    b->page_size_ = iVar2;
    b->error_ = 0;
  }
  return;
}

Assistant:

void VP8TBufferClear(VP8TBuffer* const b) {
  if (b != NULL) {
    VP8Tokens* p = b->pages_;
    while (p != NULL) {
      VP8Tokens* const next = p->next_;
      WebPSafeFree(p);
      p = next;
    }
    VP8TBufferInit(b, b->page_size_);
  }
}